

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O3

void __thiscall aeron::ClientConductor::onCheckManagedResources(ClientConductor *this,longlong now)

{
  pointer pLVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pIVar2;
  pointer pIVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ImageList *pIVar6;
  bool bVar7;
  int iVar8;
  pointer pLVar9;
  pointer pLVar10;
  long lVar11;
  pointer pLVar12;
  long lVar13;
  long lVar14;
  pointer pIVar15;
  iterator iVar16;
  pointer pIVar17;
  pointer pIVar18;
  
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar8 != 0) {
    std::__throw_system_error(iVar8);
  }
  pLVar9 = (this->m_lingeringLogBuffers).
           super__Vector_base<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (this->m_lingeringLogBuffers).
           super__Vector_base<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar11 = (long)pLVar1 - (long)pLVar9;
  lVar13 = (lVar11 >> 3) * -0x5555555555555555 >> 2;
  pLVar10 = pLVar9;
  lVar14 = lVar11;
  iVar16._M_current = pLVar1;
  if (0 < lVar13) {
    lVar14 = this->m_resourceLingerTimeoutMs;
    pLVar10 = pLVar9 + lVar13 * 4;
    lVar13 = lVar13 + 1;
    pLVar12 = pLVar9 + 2;
    do {
      if (pLVar12[-2].m_timeOfLastStatusChange + lVar14 < now) {
        pLVar12 = pLVar12 + -2;
        goto LAB_0014278e;
      }
      if (pLVar12[-1].m_timeOfLastStatusChange + lVar14 < now) {
        pLVar12 = pLVar12 + -1;
        goto LAB_0014278e;
      }
      if (pLVar12->m_timeOfLastStatusChange + lVar14 < now) goto LAB_0014278e;
      if (pLVar12[1].m_timeOfLastStatusChange + lVar14 < now) {
        pLVar12 = pLVar12 + 1;
        goto LAB_0014278e;
      }
      lVar13 = lVar13 + -1;
      pLVar12 = pLVar12 + 4;
    } while (1 < lVar13);
    lVar14 = (long)pLVar1 - (long)pLVar10;
  }
  lVar14 = (lVar14 >> 3) * -0x5555555555555555;
  if (lVar14 == 3) {
    lVar14 = this->m_resourceLingerTimeoutMs;
    pLVar12 = pLVar10;
    if (now <= pLVar10->m_timeOfLastStatusChange + lVar14) {
      pLVar10 = pLVar10 + 1;
      goto LAB_0014276c;
    }
LAB_0014278e:
    if ((pLVar12 != pLVar1) &&
       (pLVar10 = pLVar12 + 1, iVar16._M_current = pLVar12, pLVar10 != pLVar1)) {
      do {
        if (now <= this->m_resourceLingerTimeoutMs + pLVar10->m_timeOfLastStatusChange) {
          pLVar12->m_timeOfLastStatusChange = pLVar10->m_timeOfLastStatusChange;
          peVar4 = (pLVar10->m_logBuffers).
                   super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var5 = (pLVar10->m_logBuffers).
                   super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          (pLVar10->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          (pLVar10->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = (pLVar12->m_logBuffers).
                    super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          (pLVar12->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = peVar4;
          (pLVar12->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Var5;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          pLVar12 = pLVar12 + 1;
        }
        pLVar10 = pLVar10 + 1;
      } while (pLVar10 != pLVar1);
      pLVar9 = (this->m_lingeringLogBuffers).
               super__Vector_base<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = (long)(this->m_lingeringLogBuffers).
                     super__Vector_base<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar9;
      iVar16._M_current = pLVar12;
    }
  }
  else {
    if (lVar14 == 2) {
      lVar14 = this->m_resourceLingerTimeoutMs;
LAB_0014276c:
      pLVar12 = pLVar10;
      if (now <= pLVar10->m_timeOfLastStatusChange + lVar14) {
        pLVar10 = pLVar10 + 1;
        goto LAB_0014277b;
      }
      goto LAB_0014278e;
    }
    if (lVar14 == 1) {
      lVar14 = this->m_resourceLingerTimeoutMs;
LAB_0014277b:
      pLVar12 = pLVar10;
      if (now <= lVar14 + pLVar10->m_timeOfLastStatusChange) {
        pLVar12 = pLVar1;
      }
      goto LAB_0014278e;
    }
  }
  std::
  vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
  ::_M_erase(&this->m_lingeringLogBuffers,iVar16,
             (LogBuffersLingerDefn *)((long)&pLVar9->m_timeOfLastStatusChange + lVar11));
  pIVar15 = (this->m_lingeringImageLists).
            super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (this->m_lingeringImageLists).
           super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar14 = (long)pIVar2 - (long)pIVar15;
  pIVar18 = pIVar2;
  if (0 < lVar14 >> 6) {
    lVar11 = (lVar14 >> 6) + 1;
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::
              operator()((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                          *)now,(ImageListLingerDefn *)this->m_resourceLingerTimeoutMs);
      pIVar17 = pIVar15;
      if (bVar7) goto LAB_0014293d;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::
              operator()((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                          *)now,(ImageListLingerDefn *)this->m_resourceLingerTimeoutMs);
      pIVar17 = pIVar15 + 1;
      if (bVar7) goto LAB_0014293d;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::
              operator()((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                          *)now,(ImageListLingerDefn *)this->m_resourceLingerTimeoutMs);
      pIVar17 = pIVar15 + 2;
      if (bVar7) goto LAB_0014293d;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::
              operator()((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                          *)now,(ImageListLingerDefn *)this->m_resourceLingerTimeoutMs);
      pIVar17 = pIVar15 + 3;
      if (bVar7) goto LAB_0014293d;
      pIVar15 = pIVar15 + 4;
      lVar11 = lVar11 + -1;
      lVar14 = lVar14 + -0x40;
    } while (1 < lVar11);
  }
  lVar14 = lVar14 >> 4;
  if (lVar14 == 1) {
LAB_00142922:
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::operator()
                      ((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                        *)now,(ImageListLingerDefn *)this->m_resourceLingerTimeoutMs);
    pIVar17 = pIVar15;
    if (!bVar7) {
      pIVar17 = pIVar2;
    }
  }
  else if (lVar14 == 2) {
LAB_00142901:
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::operator()
                      ((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                        *)now,(ImageListLingerDefn *)this->m_resourceLingerTimeoutMs);
    pIVar17 = pIVar15;
    if (!bVar7) {
      pIVar15 = pIVar15 + 1;
      goto LAB_00142922;
    }
  }
  else {
    if (lVar14 != 3) goto LAB_00142982;
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::operator()
                      ((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                        *)now,(ImageListLingerDefn *)this->m_resourceLingerTimeoutMs);
    pIVar17 = pIVar15;
    if (!bVar7) {
      pIVar15 = pIVar15 + 1;
      goto LAB_00142901;
    }
  }
LAB_0014293d:
  pIVar15 = pIVar17;
  if (pIVar17 != pIVar2) {
    while (pIVar3 = pIVar15, pIVar15 = pIVar3 + 1, pIVar18 = pIVar17, pIVar15 != pIVar2) {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::
              operator()((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                          *)now,(ImageListLingerDefn *)this->m_resourceLingerTimeoutMs);
      if (!bVar7) {
        pIVar6 = pIVar3[1].m_imageList;
        pIVar17->m_timeOfLastStatusChange = pIVar15->m_timeOfLastStatusChange;
        pIVar17->m_imageList = pIVar6;
        pIVar17 = pIVar17 + 1;
      }
    }
  }
LAB_00142982:
  if (pIVar18 !=
      (this->m_lingeringImageLists).
      super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (this->m_lingeringImageLists).
    super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar18;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::onCheckManagedResources(long long now)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    // erase-remove idiom

    auto logIt = std::remove_if(m_lingeringLogBuffers.begin(), m_lingeringLogBuffers.end(),
        [now, this](const LogBuffersLingerDefn& entry)
        {
            return now > (entry.m_timeOfLastStatusChange + m_resourceLingerTimeoutMs);
        });

    m_lingeringLogBuffers.erase(logIt, m_lingeringLogBuffers.end());

    auto arrayIt = std::remove_if(m_lingeringImageLists.begin(), m_lingeringImageLists.end(),
        [now, this](ImageListLingerDefn & entry)
        {
            if (now > (entry.m_timeOfLastStatusChange + m_resourceLingerTimeoutMs))
            {
                delete[] entry.m_imageList->m_images;
                delete entry.m_imageList;
                entry.m_imageList = nullptr;
                return true;
            }

            return false;
        });

    m_lingeringImageLists.erase(arrayIt, m_lingeringImageLists.end());
}